

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O0

void __thiscall basisu::basisu_frontend::generate_block_endpoint_clusters(basisu_frontend *this)

{
  uint32_t uVar1;
  vector<unsigned_int> *this_00;
  uint32_t *puVar2;
  size_t in_RDI;
  uint32_t cluster_1;
  uint32_t cluster_0;
  uint32_t block_index_1;
  uint32_t subblock_index;
  uint32_t block_index;
  uint32_t cluster_indices_iter;
  vector<unsigned_int> *cluster_indices;
  int cluster_index;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint32_t uVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint32_t uVar4;
  uint local_28;
  uint local_1c;
  uint32_t local_c;
  
  vector<basisu::vec2U>::resize
            ((vector<basisu::vec2U> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_RDI,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
  local_c = 0;
  while (uVar3 = local_c,
        uVar1 = vector<basisu::vector<unsigned_int>_>::size
                          ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0xc0)),
        (int)uVar3 < (int)uVar1) {
    this_00 = vector<basisu::vector<unsigned_int>_>::operator[]
                        ((vector<basisu::vector<unsigned_int>_> *)
                         CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_1c = 0;
    while (in_stack_ffffffffffffffc0 = local_1c, uVar1 = vector<unsigned_int>::size(this_00),
          in_stack_ffffffffffffffc0 < uVar1) {
      vector<unsigned_int>::operator[]
                ((vector<unsigned_int> *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      vector<unsigned_int>::operator[]
                ((vector<unsigned_int> *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      in_stack_ffffffffffffffbc = local_c;
      vector<basisu::vec2U>::operator[]
                ((vector<basisu::vec2U> *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                 CONCAT44(local_c,in_stack_ffffffffffffffb8));
      puVar2 = vec2U::operator[]((vec2U *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffbc);
      *puVar2 = in_stack_ffffffffffffffbc;
      local_1c = local_1c + 1;
    }
    local_c = local_c + 1;
  }
  if ((*(byte *)(in_RDI + 0x20) & 1) != 0) {
    for (local_28 = 0; local_28 < *(uint *)(in_RDI + 0x40); local_28 = local_28 + 1) {
      vector<basisu::vec2U>::operator[]
                ((vector<basisu::vec2U> *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      puVar2 = vec2U::operator[]((vec2U *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffbc);
      uVar4 = *puVar2;
      vector<basisu::vec2U>::operator[]
                ((vector<basisu::vec2U> *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      puVar2 = vec2U::operator[]((vec2U *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffbc);
      if (uVar4 != *puVar2) {
        handle_verify_failure(0);
      }
    }
  }
  return;
}

Assistant:

void basisu_frontend::generate_block_endpoint_clusters()
	{
		m_block_endpoint_clusters_indices.resize(m_total_blocks);

		for (int cluster_index = 0; cluster_index < static_cast<int>(m_endpoint_clusters.size()); cluster_index++)
		{
			const basisu::vector<uint32_t>& cluster_indices = m_endpoint_clusters[cluster_index];

			for (uint32_t cluster_indices_iter = 0; cluster_indices_iter < cluster_indices.size(); cluster_indices_iter++)
			{
				const uint32_t block_index = cluster_indices[cluster_indices_iter] >> 1;
				const uint32_t subblock_index = cluster_indices[cluster_indices_iter] & 1;

				m_block_endpoint_clusters_indices[block_index][subblock_index] = cluster_index;

			} // cluster_indices_iter
		}

		if (m_params.m_validate)
		{
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				uint32_t cluster_0 = m_block_endpoint_clusters_indices[block_index][0];
				uint32_t cluster_1 = m_block_endpoint_clusters_indices[block_index][1];
				BASISU_FRONTEND_VERIFY(cluster_0 == cluster_1);
			}
		}
	}